

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::applyColScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->format_ == kColwise) {
    uVar9 = 0;
    uVar7 = (ulong)(uint)this->num_col_;
    if (this->num_col_ < 1) {
      uVar7 = uVar9;
    }
    while (uVar8 = uVar9, uVar8 != uVar7) {
      iVar2 = piVar3[uVar8 + 1];
      pdVar4 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar3[uVar8]; uVar9 = uVar8 + 1, lVar10 < iVar2; lVar10 = lVar10 + 1) {
        pdVar5[lVar10] = pdVar4[uVar8] * pdVar5[lVar10];
      }
    }
  }
  else {
    uVar9 = 0;
    uVar7 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar7 = uVar9;
    }
    while (uVar9 != uVar7) {
      piVar1 = piVar3 + uVar9;
      iVar2 = piVar3[uVar9 + 1];
      uVar9 = uVar9 + 1;
      piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)*piVar1; lVar10 < iVar2; lVar10 = lVar10 + 1) {
        pdVar4[lVar10] = pdVar5[piVar6[lVar10]] * pdVar4[lVar10];
      }
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}